

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.cpp
# Opt level: O0

uint __thiscall NetworkNS::RanMars::devrand(RanMars *this)

{
  ssize_t sVar1;
  uint local_18;
  int local_14;
  uint r;
  int fn;
  RanMars *this_local;
  
  _r = this;
  local_14 = open("/dev/urandom",0);
  if (local_14 == -1) {
    exit(-1);
  }
  sVar1 = read(local_14,&local_18,4);
  if (sVar1 != 4) {
    exit(-1);
  }
  close(local_14);
  return local_18;
}

Assistant:

unsigned int RanMars::devrand()
    {

        int fn;
        unsigned int r;
        fn = open("/dev/urandom", O_RDONLY);
        if (fn == -1)
            exit(-1); /* Failed! */
        if (read(fn, &r, 4) != 4)
            exit(-1); /* Failed! */
        close(fn);
        return r;
    }